

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsExpressionFunctions.cpp
# Opt level: O2

void registerMipsExpressionFunctions(ExpressionFunctionHandler *handler)

{
  long lVar1;
  allocator<char> local_71;
  string local_70;
  string local_50 [32];
  
  for (lVar1 = 0x20; lVar1 != 0x70; lVar1 = lVar1 + 0x28) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,*(char **)((long)&PTR_getWordSize_001b60e0 + lVar1),&local_71);
    Identifier::Identifier((Identifier *)local_50,&local_70);
    ExpressionFunctionHandler::addFunction
              (handler,(Identifier *)local_50,
               *(ExpressionFunction *)((long)&CMipsArchitecture::typeinfo + lVar1),
               *(size_t *)((long)&PTR_typeinfo_name_001b60f0 + lVar1),
               *(size_t *)((long)&PTR_typeinfo_001b60f8 + lVar1),
               *(ExpFuncSafety *)((long)&mipsExpressionFunctions[0].name + lVar1));
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void registerMipsExpressionFunctions(ExpressionFunctionHandler &handler)
{
	for (const auto &func : mipsExpressionFunctions)
	{
		handler.addFunction(Identifier(func.name), func.function, func.minParams, func.maxParams, func.safety);
	}
}